

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_overlong_path(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  undefined1 *puVar3;
  uv_handle_t *handle;
  int64_t eval_b_1;
  int64_t eval_b_2;
  uv_connect_t req;
  uv_pipe_t pipe;
  char path [512];
  undefined1 auStack_370 [16];
  uv_loop_t *local_360;
  uv_connect_t local_358;
  uv_pipe_t local_2f0;
  long local_208 [64];
  
  puVar3 = auStack_370 + 8;
  auStack_370._0_8_ = (void *)0x1ace9e;
  puVar2 = uv_default_loop();
  auStack_370._0_8_ = (void *)0x1acead;
  iVar1 = uv_pipe_init(puVar2,&local_2f0,0);
  local_208[0] = (long)iVar1;
  local_358.data = (uv_loop_t *)0x0;
  if (local_208[0] == 0) {
    auStack_370._0_8_ = (void *)0x1aceed;
    memset(local_208,0x40,0x200);
    local_358.data = (uv_loop_t *)0xffffffffffffffdc;
    auStack_370._0_8_ = (void *)0x1acf0d;
    iVar1 = uv_pipe_bind2(&local_2f0,(char *)local_208,0x200,1);
    auStack_370._8_8_ = SEXT48(iVar1);
    if (local_358.data != (void *)auStack_370._8_8_) goto LAB_001ad0c1;
    auStack_370._8_8_ = (uv_loop_t *)0xffffffffffffffdc;
    auStack_370._0_8_ = (void *)0x1acf53;
    iVar1 = uv_pipe_connect2(&local_358,&local_2f0,(char *)local_208,0x200,1,abort);
    local_360 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_370._8_8_ != local_360) goto LAB_001ad0ce;
    auStack_370._0_8_ = (void *)0x1acf6e;
    puVar2 = uv_default_loop();
    auStack_370._0_8_ = (void *)0x1acf78;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_370._8_8_ = SEXT48(iVar1);
    local_360 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_370._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad0db;
    auStack_370._8_8_ = (uv_loop_t *)0xffffffffffffffea;
    auStack_370._0_8_ = (void *)0x1acfaf;
    iVar1 = uv_pipe_bind(&local_2f0,"");
    local_360 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_370._8_8_ != local_360) goto LAB_001ad0e8;
    auStack_370._0_8_ = (void *)0x1acfe2;
    uv_pipe_connect(&local_358,&local_2f0,"",connect_overlong_cb);
    auStack_370._0_8_ = (void *)0x1acfe7;
    puVar2 = uv_default_loop();
    auStack_370._0_8_ = (void *)0x1acff1;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_370._8_8_ = SEXT48(iVar1);
    local_360 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_370._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad0f5;
    auStack_370._8_8_ = (uv_loop_t *)0x1;
    local_360 = (uv_loop_t *)(long)connect_cb_called;
    if (local_360 != (uv_loop_t *)0x1) goto LAB_001ad102;
    auStack_370._8_8_ = (uv_loop_t *)0x1;
    local_360 = (uv_loop_t *)(long)close_cb_called;
    if (local_360 == (uv_loop_t *)0x1) {
      auStack_370._0_8_ = (void *)0x1ad05a;
      puVar2 = uv_default_loop();
      auStack_370._0_8_ = (void *)0x1ad06e;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      auStack_370._0_8_ = (void *)0x1ad078;
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_370._8_8_ = (uv_loop_t *)0x0;
      auStack_370._0_8_ = (void *)0x1ad085;
      puVar2 = uv_default_loop();
      auStack_370._0_8_ = (void *)0x1ad08d;
      iVar1 = uv_loop_close(puVar2);
      local_360 = (uv_loop_t *)(long)iVar1;
      if ((uv_loop_t *)auStack_370._8_8_ == local_360) {
        auStack_370._0_8_ = (void *)0x1ad0a4;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ad11c;
    }
  }
  else {
    auStack_370._0_8_ = (void *)0x1ad0c1;
    run_test_pipe_overlong_path_cold_1();
LAB_001ad0c1:
    auStack_370._0_8_ = (void *)0x1ad0ce;
    run_test_pipe_overlong_path_cold_2();
LAB_001ad0ce:
    auStack_370._0_8_ = (void *)0x1ad0db;
    run_test_pipe_overlong_path_cold_3();
LAB_001ad0db:
    auStack_370._0_8_ = (void *)0x1ad0e8;
    run_test_pipe_overlong_path_cold_4();
LAB_001ad0e8:
    auStack_370._0_8_ = (void *)0x1ad0f5;
    run_test_pipe_overlong_path_cold_5();
LAB_001ad0f5:
    auStack_370._0_8_ = (void *)0x1ad102;
    run_test_pipe_overlong_path_cold_6();
LAB_001ad102:
    auStack_370._0_8_ = (void *)0x1ad10f;
    run_test_pipe_overlong_path_cold_7();
  }
  auStack_370._0_8_ = (void *)0x1ad11c;
  run_test_pipe_overlong_path_cold_8();
LAB_001ad11c:
  iVar1 = (int)&local_360;
  auStack_370._0_8_ = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  auStack_370._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_370._0_8_ == (void *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(*(uv_handle_t **)(puVar3 + 0x50),close_cb);
    return extraout_EAX;
  }
  handle = (uv_handle_t *)auStack_370;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(pipe_overlong_path) {
  uv_pipe_t pipe;
  uv_connect_t req;

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe, 0));

#ifndef _WIN32
  char path[512];
  memset(path, '@', sizeof(path));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_bind2(&pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_connect2(&req,
                             &pipe,
                             path,
                             sizeof(path),
                             UV_PIPE_NO_TRUNCATE,
                             (uv_connect_cb) abort));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
#endif

  ASSERT_EQ(UV_EINVAL, uv_pipe_bind(&pipe, ""));
  uv_pipe_connect(&req,
                  &pipe,
                  "",
                  (uv_connect_cb) connect_overlong_cb);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;

}